

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

exception<kratos::InvalidConversionException> *
pybind11::detail::register_exception_impl<kratos::InvalidConversionException>
          (handle scope,char *name,handle base,bool isLocal)

{
  object *this;
  code *pcVar1;
  object local_38;
  
  this = &get_exception_object<kratos::InvalidConversionException>()->super_object;
  if ((this->super_handle).m_ptr == (PyObject *)0x0) {
    exception<kratos::InvalidConversionException>::exception
              ((exception<kratos::InvalidConversionException> *)&local_38,scope,name,base);
    object::operator=(this,&local_38);
    object::~object(&local_38);
  }
  pcVar1 = register_exception_translator;
  if (isLocal) {
    pcVar1 = register_local_exception_translator;
  }
  local_38.super_handle.m_ptr =
       (handle)register_exception_impl<kratos::InvalidConversionException>(pybind11::handle,char_const*,pybind11::handle,bool)
               ::{lambda(std::__exception_ptr::exception_ptr)#1}::exception_ptr_;
  (*pcVar1)();
  return (exception<kratos::InvalidConversionException> *)this;
}

Assistant:

exception<CppException> &register_exception_impl(handle scope,
                                                const char *name,
                                                handle base,
                                                bool isLocal) {
    auto &ex = detail::get_exception_object<CppException>();
    if (!ex) ex = exception<CppException>(scope, name, base);

    auto register_func = isLocal ? &register_local_exception_translator
                                 : &register_exception_translator;

    register_func([](std::exception_ptr p) {
        if (!p) return;
        try {
            std::rethrow_exception(p);
        } catch (const CppException &e) {
            detail::get_exception_object<CppException>()(e.what());
        }
    });
    return ex;
}